

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetCompileDefinitions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *config,string *language)

{
  cmTarget *pcVar1;
  cmMakefile *this_00;
  cmLocalGenerator *this_01;
  Snapshot snapshot;
  undefined8 uVar2;
  PolicyStatus PVar3;
  char *pcVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  PolicyID id;
  cmCompiledGeneratorExpression *x;
  bool debugOptions;
  auto_ptr<cmCompiledGeneratorExpression> local_380;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceCompileDefinitionsEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_2f8 [32];
  long local_2d8;
  Snapshot local_2d0;
  string configPropName;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueOptions;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set(&uniqueOptions);
  pcVar1 = this->Target;
  std::__cxx11::string::string((string *)&e,"COMPILE_DEFINITIONS",(allocator *)&cge);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&pcVar1->Name,(string *)&e,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&e);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator *)&cge);
  pcVar4 = cmMakefile::GetDefinition(this_00,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::string((string *)&e,pcVar4,(allocator *)&cge);
    cmSystemTools::ExpandListArgument((string *)&e,&debugProperties,false);
    std::__cxx11::string::~string((string *)&e);
  }
  if (this->DebugCompileDefinitionsDone == false) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"COMPILE_DEFINITIONS");
    debugOptions = _Var5._M_current !=
                   debugProperties.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugOptions = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugCompileDefinitionsDone = true;
  }
  processCompileDefinitions
            (this,&this->CompileDefinitionsEntries,list,&uniqueOptions,&dagChecker,config,
             debugOptions,language);
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&e,"INTERFACE_COMPILE_DEFINITIONS",(allocator *)&cge);
  AddInterfaceEntries(this,config,(string *)&e,&linkInterfaceCompileDefinitionsEntries);
  std::__cxx11::string::~string((string *)&e);
  if (config->_M_string_length == 0) goto LAB_0041d9ac;
  cmsys::SystemTools::UpperCase((string *)&e,config);
  std::operator+(&configPropName,"COMPILE_DEFINITIONS_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar4 = GetProperty(this,&configPropName);
  if (pcVar4 != (char *)0x0) {
    PVar3 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0043);
    if (PVar3 != OLD) {
      if (PVar3 != WARN) goto LAB_0041d99f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&cge,(cmPolicies *)0x2b,id);
      std::operator<<((ostream *)&e,(string *)&cge);
      std::__cxx11::string::~string((string *)&cge);
      this_01 = this->LocalGenerator;
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_01,AUTHOR_WARNING,(string *)&cge);
      std::__cxx11::string::~string((string *)&cge);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    cmState::Snapshot::Snapshot(&local_2d0,(cmState *)0x0);
    local_2f8._0_8_ = local_2f8 + 0x10;
    local_2f8._8_8_ = 0;
    local_2f8[0x10] = '\0';
    local_2d8 = 0;
    snapshot.Position.Tree = local_2d0.Position.Tree;
    snapshot.State = local_2d0.State;
    snapshot.Position.Position._0_1_ = (char)local_2d0.Position.Position;
    snapshot.Position.Position._1_7_ = (int7)(local_2d0.Position.Position >> 8);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&cge,snapshot,(cmCommandContext *)local_2f8);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&e,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    std::__cxx11::string::~string((string *)local_2f8);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_2f8,(char *)&e);
    uVar2 = local_2f8._0_8_;
    local_2f8._0_8_ = (pointer)0x0;
    cge.x_ = (cmCompiledGeneratorExpression *)uVar2;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_2f8);
    local_2f8._0_8_ = operator_new(0x10);
    cge.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_380.x_ = (cmCompiledGeneratorExpression *)0x0;
    *(undefined8 *)local_2f8._0_8_ = uVar2;
    *(cmLinkImplItem **)(local_2f8._0_8_ + 8) = &TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&linkInterfaceCompileDefinitionsEntries,(TargetPropertyEntry **)local_2f8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_380);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&e);
  }
LAB_0041d99f:
  std::__cxx11::string::~string((string *)&configPropName);
LAB_0041d9ac:
  processCompileDefinitions
            (this,&linkInterfaceCompileDefinitionsEntries,list,&uniqueOptions,&dagChecker,config,
             debugOptions,language);
  cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
            (&linkInterfaceCompileDefinitionsEntries);
  std::
  _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::~_Vector_base(&linkInterfaceCompileDefinitionsEntries.
                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable(&uniqueOptions._M_ht);
  return;
}

Assistant:

void cmGeneratorTarget::GetCompileDefinitions(std::vector<std::string> &list,
                                            const std::string& config,
                                            const std::string& language) const
{
  UNORDERED_SET<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "COMPILE_DEFINITIONS", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugDefines = !this->DebugCompileDefinitionsDone
                          && std::find(debugProperties.begin(),
                                debugProperties.end(),
                                "COMPILE_DEFINITIONS")
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugCompileDefinitionsDone = true;
    }

  processCompileDefinitions(this,
                            this->CompileDefinitionsEntries,
                            list,
                            uniqueOptions,
                            &dagChecker,
                            config,
                            debugDefines,
                            language);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceCompileDefinitionsEntries;
  AddInterfaceEntries(
    this, config, "INTERFACE_COMPILE_DEFINITIONS",
    linkInterfaceCompileDefinitionsEntries);
  if (!config.empty())
    {
    std::string configPropName = "COMPILE_DEFINITIONS_"
                                        + cmSystemTools::UpperCase(config);
    const char *configProp = this->GetProperty(configPropName);
    if (configProp)
      {
      switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0043))
        {
        case cmPolicies::WARN:
          {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0043);
          this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING,
                                       e.str());
          }
        case cmPolicies::OLD:
          {
          cmGeneratorExpression ge;
          cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                                                      ge.Parse(configProp);
          linkInterfaceCompileDefinitionsEntries
                .push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
          }
          break;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    }

  processCompileDefinitions(this,
                            linkInterfaceCompileDefinitionsEntries,
                            list,
                            uniqueOptions,
                            &dagChecker,
                            config,
                            debugDefines,
                            language);

  cmDeleteAll(linkInterfaceCompileDefinitionsEntries);
}